

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QString *name)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  QString *optionName;
  QString *str;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)&this->d->optionNames,name,CaseSensitive);
  bVar2 = true;
  if (!bVar1) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QCommandLineParserPrivate::aliases((QStringList *)&local_48,this->d,name);
    str = (this->d->optionNames).d.ptr;
    lVar3 = (this->d->optionNames).d.size * 0x18;
    do {
      bVar2 = lVar3 != 0;
      if (lVar3 == 0) break;
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&local_48,str,CaseSensitive);
      str = str + 1;
      lVar3 = lVar3 + -0x18;
    } while (!bVar1);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::isSet(const QString &name) const
{
    d->checkParsed("isSet");
    if (d->optionNames.contains(name))
        return true;
    const QStringList aliases = d->aliases(name);
    for (const QString &optionName : std::as_const(d->optionNames)) {
        if (aliases.contains(optionName))
            return true;
    }
    return false;
}